

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O1

void aes_sdctr_sw(ssh_cipher *ciph,void *vblk,int blklen)

{
  ssh_cipheralg *psVar1;
  ssh_cipheralg *psVar2;
  ssh_cipheralg *psVar3;
  ssh_cipheralg *psVar4;
  ssh_cipheralg *psVar5;
  ssh_cipheralg *psVar6;
  ssh_cipheralg *psVar7;
  ssh_cipheralg *psVar8;
  ssh_cipheralg *psVar9;
  bool bVar10;
  uint7 uVar11;
  uint7 uVar12;
  undefined1 *puVar13;
  ssh_cipher *psVar14;
  byte bVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ssh_cipher *psVar19;
  int iVar20;
  undefined1 *puVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint8_t *blk;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  void *pvVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  uint8_t *p;
  ulong local_d8;
  
  if (0 < blklen) {
    psVar1 = (ssh_cipheralg *)(ciph + -1);
    pvVar45 = (void *)((long)blklen + (long)vblk);
    do {
      if ((ssh_cipheralg *)psVar1->new == psVar1) {
        puVar13 = (undefined1 *)((long)&ciph[-8].vt + 7);
        lVar16 = -0x48;
        do {
          lVar27 = 0;
          puVar21 = puVar13;
          do {
            psVar2 = ciph[lVar27 + -0xb].vt;
            ((ssh_cipher *)(puVar21 + -7))->vt =
                 (ssh_cipheralg *)
                 ((ulong)psVar2 >> 0x38 | ((ulong)psVar2 & 0xff000000000000) >> 0x28 |
                  ((ulong)psVar2 & 0xff0000000000) >> 0x18 | ((ulong)psVar2 & 0xff00000000) >> 8 |
                  ((ulong)psVar2 & 0xff000000) << 8 | ((ulong)psVar2 & 0xff0000) << 0x18 |
                  ((ulong)psVar2 & 0xff00) << 0x28 | (long)psVar2 << 0x38);
            lVar27 = lVar27 + 1;
            puVar21 = puVar21 + -8;
          } while (lVar27 == 1);
          uVar28 = 1;
          lVar27 = 0;
          do {
            psVar19 = ciph + lVar27 + -0xb;
            psVar2 = psVar19->vt;
            psVar19->vt = (ssh_cipheralg *)((long)&psVar19->vt->new + uVar28);
            uVar28 = (ulong)CARRY8((ulong)psVar2,uVar28);
            lVar27 = lVar27 + 1;
          } while (lVar27 == 1);
          puVar13 = puVar13 + 0x10;
          bVar10 = lVar16 < -0x18;
          lVar16 = lVar16 + 0x10;
        } while (bVar10);
        psVar2 = ciph[-9].vt;
        psVar3 = ciph[-8].vt;
        uVar31 = (((ulong)psVar2 >> 7 ^ (ulong)*(uint7 *)&ciph[-9].vt) & 0xaa00aa00aa00aa) * 0x81 ^
                 (ulong)psVar2;
        uVar28 = (((ulong)psVar3 >> 7 ^ (ulong)*(uint7 *)&ciph[-8].vt) & 0xaa00aa00aa00aa) * 0x81 ^
                 (ulong)psVar3;
        uVar31 = ((uVar31 >> 0xe ^ uVar31) & 0xcccc0000cccc) * 0x4001 ^ uVar31;
        uVar28 = ((uVar28 >> 0xe ^ uVar28) & 0xcccc0000cccc) * 0x4001 ^ uVar28;
        uVar48 = (ulong)(((uint)(uVar31 >> 0x1c) ^ (uint)uVar31) & 0xf0f0f0f0);
        uVar31 = (uVar48 << 0x1c | uVar48) ^ uVar31;
        uVar48 = (ulong)(((uint)(uVar28 >> 0x1c) ^ (uint)uVar28) & 0xf0f0f0f0);
        uVar28 = (uVar48 << 0x1c | uVar48) ^ uVar28;
        uVar26 = (uVar31 >> 8 ^ uVar28) & 0xff00ff00ff00ff;
        uVar31 = uVar26 << 8 ^ uVar31;
        uVar26 = uVar26 ^ uVar28;
        local_d8 = uVar31 & 0xffff;
        uVar53 = uVar31 >> 0x10 & 0xffff;
        uVar30 = uVar31 >> 0x20 & 0xffff;
        uVar31 = uVar31 >> 0x30;
        uVar48 = uVar26 & 0xffff;
        uVar36 = uVar26 >> 0x10 & 0xffff;
        uVar28 = uVar26 >> 0x20 & 0xffff;
        uVar26 = uVar26 >> 0x30;
        lVar16 = 0x10;
        do {
          uVar11 = CONCAT16(*(undefined1 *)((long)ciph + lVar16 + -0x42),
                            CONCAT15(*(undefined1 *)((long)ciph + lVar16 + -0x43),
                                     CONCAT14(*(undefined1 *)((long)ciph + lVar16 + -0x44),
                                              *(undefined4 *)((long)&ciph[-9].vt + lVar16))));
          uVar22 = CONCAT17(*(undefined1 *)((long)ciph + lVar16 + -0x41),uVar11);
          uVar12 = CONCAT16(*(undefined1 *)((long)ciph + lVar16 + -0x3a),
                            CONCAT15(*(undefined1 *)((long)ciph + lVar16 + -0x3b),
                                     CONCAT14(*(undefined1 *)((long)ciph + lVar16 + -0x3c),
                                              *(undefined4 *)((long)&ciph[-8].vt + lVar16))));
          uVar41 = CONCAT17(*(undefined1 *)((long)ciph + lVar16 + -0x39),uVar12);
          uVar22 = ((uVar22 >> 7 ^ (ulong)uVar11) & 0xaa00aa00aa00aa) * 0x81 ^ uVar22;
          uVar41 = ((uVar41 >> 7 ^ (ulong)uVar12) & 0xaa00aa00aa00aa) * 0x81 ^ uVar41;
          uVar22 = ((uVar22 >> 0xe ^ uVar22) & 0xcccc0000cccc) * 0x4001 ^ uVar22;
          uVar41 = ((uVar41 >> 0xe ^ uVar41) & 0xcccc0000cccc) * 0x4001 ^ uVar41;
          uVar23 = (ulong)(((uint)(uVar22 >> 0x1c) ^ (uint)uVar22) & 0xf0f0f0f0);
          uVar22 = (uVar23 << 0x1c | uVar23) ^ uVar22;
          uVar23 = (ulong)(((uint)(uVar41 >> 0x1c) ^ (uint)uVar41) & 0xf0f0f0f0);
          uVar41 = (uVar23 << 0x1c | uVar23) ^ uVar41;
          uVar23 = (uVar22 >> 8 ^ uVar41) & 0xff00ff00ff00ff;
          uVar22 = uVar23 << 8 ^ uVar22;
          uVar23 = uVar23 ^ uVar41;
          bVar15 = (byte)lVar16;
          local_d8 = local_d8 | (uVar22 & 0xffff) << (bVar15 & 0x3f);
          uVar53 = uVar53 | (uVar22 >> 0x10 & 0xffff) << (bVar15 & 0x3f);
          uVar30 = uVar30 | (uVar22 >> 0x20 & 0xffff) << (bVar15 & 0x3f);
          uVar31 = uVar31 | (uVar22 >> 0x30) << (bVar15 & 0x3f);
          uVar48 = uVar48 | (uVar23 & 0xffff) << (bVar15 & 0x3f);
          uVar36 = uVar36 | (uVar23 >> 0x10 & 0xffff) << (bVar15 & 0x3f);
          uVar28 = uVar28 | (uVar23 >> 0x20 & 0xffff) << (bVar15 & 0x3f);
          uVar26 = uVar26 | (uVar23 >> 0x30) << (bVar15 & 0x3f);
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x40);
        local_d8 = local_d8 ^ (ulong)ciph[-0xa2].vt;
        uVar48 = uVar48 ^ (ulong)ciph[-0xa1].vt;
        uVar53 = uVar53 ^ (ulong)ciph[-0xa0].vt;
        uVar36 = uVar36 ^ (ulong)ciph[-0x9f].vt;
        uVar30 = uVar30 ^ (ulong)ciph[-0x9e].vt;
        uVar28 = uVar28 ^ (ulong)ciph[-0x9d].vt;
        uVar31 = uVar31 ^ (ulong)ciph[-0x9c].vt;
        uVar26 = uVar26 ^ (ulong)ciph[-0x9b].vt;
        iVar20 = *(int *)&ciph[-0xc].vt + -1;
        psVar14 = ciph + -0xa2;
        psVar19 = ciph + -0x9a;
        if (iVar20 != 0) {
          do {
            psVar19 = psVar14;
            uVar22 = uVar30 ^ uVar53;
            uVar41 = uVar26 ^ uVar48;
            uVar23 = uVar26 ^ uVar30;
            uVar42 = uVar26 ^ uVar53;
            uVar28 = uVar28 ^ uVar31;
            uVar17 = uVar41 ^ uVar22;
            uVar53 = uVar53 ^ uVar36 ^ uVar17;
            uVar31 = uVar36 ^ uVar17 ^ uVar31;
            uVar25 = uVar53 ^ uVar28;
            uVar18 = uVar31 ^ uVar23;
            uVar46 = uVar25 & uVar42 ^ uVar18 & uVar23;
            uVar29 = (uVar25 ^ uVar18) & uVar22 ^ uVar18 & uVar23;
            uVar24 = uVar28 ^ local_d8;
            uVar48 = uVar48 ^ uVar24;
            uVar28 = uVar28 ^ uVar18;
            uVar37 = uVar31 ^ uVar53 & uVar17 ^ (uVar53 ^ local_d8) & (uVar48 ^ uVar42) ^ uVar29;
            uVar29 = uVar48 & uVar24 ^ uVar28 ^ uVar28 & uVar41 ^ uVar41 ^ uVar29;
            uVar31 = (uVar30 ^ uVar24) & local_d8 ^ uVar42 ^ uVar25 ^ uVar53 & uVar17 ^ uVar46;
            uVar46 = uVar28 & uVar41 ^ uVar26 ^ (uVar18 ^ local_d8) & (uVar24 ^ uVar26) ^ uVar28 ^
                     uVar46;
            uVar52 = uVar29 & uVar37;
            uVar37 = uVar37 ^ uVar31;
            uVar47 = (uVar46 ^ uVar52) & uVar37 ^ uVar31;
            uVar36 = (uVar31 ^ uVar52) & (uVar46 ^ uVar29);
            uVar31 = uVar36 ^ uVar46;
            uVar36 = (uVar36 ^ uVar52) & uVar46;
            uVar29 = uVar29 ^ uVar36;
            uVar37 = (uVar36 ^ uVar46 ^ uVar52) & uVar47 ^ uVar37;
            uVar38 = uVar29 ^ uVar31;
            uVar49 = uVar47 ^ uVar31;
            uVar46 = uVar37 ^ uVar38;
            uVar39 = uVar38 & (uVar48 ^ uVar42);
            uVar52 = (uVar18 ^ local_d8) & uVar47;
            uVar28 = uVar28 & (uVar37 ^ uVar47);
            uVar41 = (uVar37 ^ uVar47) & uVar41;
            uVar36 = uVar53 & uVar29 ^ uVar28;
            uVar33 = (uVar25 ^ uVar18) & (uVar46 ^ uVar49);
            uVar22 = (uVar46 ^ uVar49) & uVar22;
            uVar43 = uVar37 & uVar48 ^ uVar52;
            uVar28 = uVar18 & uVar49 ^ uVar28 ^ uVar33;
            uVar48 = uVar41 ^ local_d8 & uVar31 ^ uVar36;
            uVar50 = uVar49 & uVar23 ^ uVar22;
            uVar49 = uVar48 ^ uVar43 ^ uVar50;
            uVar50 = uVar50 ^ uVar24 & uVar37;
            uVar54 = uVar25 & uVar46 ^ uVar33 ^ uVar50;
            uVar50 = uVar50 ^ uVar39 ^ uVar29 & uVar17;
            uVar17 = uVar24 & uVar37 ^ uVar28;
            uVar23 = uVar47 & (uVar24 ^ uVar26) ^ uVar48 ^ uVar54;
            uVar34 = (uVar53 ^ local_d8) & uVar38 ^ uVar50;
            uVar50 = uVar50 ^ uVar28;
            uVar54 = uVar54 ^ uVar41 ^ uVar43;
            uVar36 = uVar36 ^ uVar34;
            uVar34 = uVar34 ^ uVar52 ^ local_d8 & uVar31;
            uVar52 = uVar31 & (uVar30 ^ uVar24) ^ uVar39 ^ uVar23;
            uVar23 = uVar46 & uVar42 ^ uVar22 ^ uVar17 ^ uVar23;
            uVar17 = uVar36 ^ uVar17;
            uVar51 = ((uVar49 >> 8 ^ uVar49) & 0xcc00cc00cc00cc) * 0x101 ^ uVar49;
            uVar28 = uVar51 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar22 = (uVar51 & 0xa000a000a000a) << 0xc;
            uVar35 = ((uVar54 >> 8 ^ uVar54) & 0xcc00cc00cc00cc) * 0x101 ^ uVar54;
            uVar31 = uVar35 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar18 = (uVar35 & 0xa000a000a000a) << 0xc;
            uVar41 = ((uVar52 >> 8 ^ uVar52) & 0xcc00cc00cc00cc) * 0x101 ^ uVar52;
            uVar46 = (uVar41 & 0xa000a000a000a) << 0xc;
            uVar33 = uVar41 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar44 = ((uVar34 >> 8 ^ uVar34) & 0xcc00cc00cc00cc) * 0x101 ^ uVar34;
            uVar24 = (uVar44 & 0xa000a000a000a) << 0xc;
            uVar48 = uVar44 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar25 = ((uVar36 >> 8 ^ uVar36) & 0xcc00cc00cc00cc) * 0x101 ^ uVar36;
            uVar37 = (uVar25 & 0xa000a000a000a) << 0xc;
            uVar29 = ((uVar23 >> 8 ^ uVar23) & 0xcc00cc00cc00cc) * 0x101 ^ uVar23;
            uVar38 = (uVar29 & 0xa000a000a000a) << 0xc;
            uVar26 = uVar25 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar43 = uVar29 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar55 = ((uVar17 >> 8 ^ uVar17) & 0xcc00cc00cc00cc) * 0x101 ^ uVar17;
            uVar30 = (uVar55 & 0xa000a000a000a) << 0xc;
            uVar39 = uVar55 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar47 = ((uVar50 >> 8 ^ uVar50) & 0xcc00cc00cc00cc) * 0x101 ^ uVar50;
            uVar53 = (uVar47 & 0xa000a000a000a) << 0xc;
            uVar42 = uVar47 >> 4 & 0xaaa0aaa0aaa0aaa;
            uVar49 = (uVar51 & 0x4444444444444444 | uVar22 | uVar28) >> 1 |
                     (uVar49 & 0x1111111111111111) << 3;
            uVar54 = (uVar35 & 0x4444444444444444 | uVar18 | uVar31) >> 1 |
                     (uVar54 & 0x1111111111111111) << 3;
            uVar32 = (uVar41 & 0x4444444444444444 | uVar46 | uVar33) >> 1 |
                     (uVar52 & 0x1111111111111111) << 3;
            uVar40 = (uVar44 & 0x4444444444444444 | uVar24 | uVar48) >> 1 |
                     (uVar34 & 0x1111111111111111) << 3;
            uVar34 = (uVar25 & 0x4444444444444444 | uVar37 | uVar26) >> 1 |
                     (uVar36 & 0x1111111111111111) << 3;
            uVar52 = (uVar29 & 0x4444444444444444 | uVar38 | uVar43) >> 1 |
                     (uVar23 & 0x1111111111111111) << 3;
            uVar17 = (uVar55 & 0x4444444444444444 | uVar30 | uVar39) >> 1 |
                     (uVar17 & 0x1111111111111111) << 3;
            uVar23 = (uVar47 & 0x4444444444444444 | uVar53 | uVar42) >> 1 |
                     (uVar50 & 0x1111111111111111) << 3;
            uVar50 = (uVar51 & 0x5555555555555555 | uVar22 | uVar28) ^ uVar49;
            uVar36 = (uVar35 & 0x5555555555555555 | uVar18 | uVar31) ^ uVar54;
            uVar28 = (uVar41 & 0x5555555555555555 | uVar46 | uVar33) ^ uVar32;
            uVar22 = (uVar47 & 0x5555555555555555 | uVar53 | uVar42) ^ uVar23;
            uVar41 = (uVar44 & 0x5555555555555555 | uVar24 | uVar48) ^ uVar40;
            uVar31 = (uVar25 & 0x5555555555555555 | uVar37 | uVar26) ^ uVar34;
            uVar26 = (uVar29 & 0x5555555555555555 | uVar38 | uVar43) ^ uVar52;
            uVar18 = (uVar55 & 0x5555555555555555 | uVar30 | uVar39) ^ uVar17;
            local_d8 = uVar49 ^ uVar22 ^
                       (uVar50 >> 2 & 0x3333333333333333 | uVar50 * 4 & 0xcccccccccccccccc) ^
                       (ulong)psVar19[8].vt;
            uVar48 = uVar54 ^ uVar50 ^ uVar22 ^
                     (uVar36 >> 2 & 0x3333333333333333 | uVar36 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar19[9].vt;
            uVar53 = uVar32 ^ uVar36 ^
                     (uVar28 >> 2 & 0x3333333333333333 | uVar28 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar19[10].vt;
            uVar36 = uVar40 ^ uVar22 ^ uVar28 ^
                     (uVar41 >> 2 & 0x3333333333333333 | uVar41 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar19[0xb].vt;
            uVar30 = uVar22 ^ uVar34 ^ uVar41 ^
                     (uVar31 >> 2 & 0x3333333333333333 | uVar31 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar19[0xc].vt;
            uVar28 = uVar52 ^ uVar31 ^
                     (uVar26 >> 2 & 0x3333333333333333 | uVar26 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar19[0xd].vt;
            uVar31 = uVar17 ^ uVar26 ^
                     (uVar18 >> 2 & 0x3333333333333333 | uVar18 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar19[0xe].vt;
            uVar26 = uVar23 ^ uVar18 ^
                     (uVar22 >> 2 & 0x3333333333333333 | uVar22 * 4 & 0xcccccccccccccccc) ^
                     (ulong)psVar19[0xf].vt;
            psVar14 = psVar19 + 8;
            iVar20 = iVar20 + -1;
          } while (iVar20 != 0);
          psVar19 = psVar19 + 0x10;
        }
        uVar23 = uVar53 ^ uVar30;
        uVar17 = uVar48 ^ uVar26;
        uVar22 = uVar53 ^ uVar26;
        uVar28 = uVar28 ^ uVar31;
        uVar41 = local_d8 ^ uVar28;
        uVar42 = uVar17 ^ uVar23;
        uVar53 = uVar53 ^ uVar36 ^ uVar42;
        uVar31 = uVar36 ^ uVar42 ^ uVar31;
        uVar52 = uVar30 ^ uVar26;
        uVar49 = uVar53 ^ uVar28;
        uVar47 = uVar31 ^ uVar52;
        uVar36 = (uVar49 ^ uVar47) & uVar23 ^ uVar47 & uVar52;
        uVar46 = uVar49 & uVar22 ^ uVar47 & uVar52;
        uVar48 = uVar48 ^ uVar41;
        uVar28 = uVar28 ^ uVar47;
        uVar33 = uVar31 ^ uVar53 & uVar42 ^ (uVar53 ^ local_d8) & (uVar48 ^ uVar22) ^ uVar36;
        uVar36 = uVar48 & uVar41 ^ uVar28 ^ uVar28 & uVar17 ^ uVar17 ^ uVar36;
        uVar24 = (uVar41 ^ uVar30) & local_d8 ^ uVar22 ^ uVar49 ^ uVar53 & uVar42 ^ uVar46;
        uVar46 = uVar28 & uVar17 ^ uVar26 ^ (uVar47 ^ local_d8) & (uVar41 ^ uVar26) ^ uVar28 ^
                 uVar46;
        uVar31 = uVar36 & uVar33;
        uVar33 = uVar33 ^ uVar24;
        uVar18 = (uVar46 ^ uVar31) & uVar33 ^ uVar24;
        uVar25 = (uVar24 ^ uVar31) & (uVar46 ^ uVar36);
        uVar24 = uVar25 ^ uVar46;
        uVar25 = (uVar25 ^ uVar31) & uVar46;
        uVar36 = uVar36 ^ uVar25;
        uVar33 = (uVar25 ^ uVar46 ^ uVar31) & uVar18 ^ uVar33;
        uVar25 = uVar36 ^ uVar24;
        uVar43 = uVar33 ^ uVar25;
        uVar29 = uVar25 & (uVar48 ^ uVar22);
        uVar38 = uVar18 ^ uVar24;
        uVar28 = uVar28 & (uVar33 ^ uVar18);
        uVar17 = (uVar33 ^ uVar18) & uVar17;
        uVar39 = (uVar47 ^ local_d8) & uVar18;
        uVar31 = (uVar49 ^ uVar47) & (uVar43 ^ uVar38);
        uVar23 = (uVar43 ^ uVar38) & uVar23;
        uVar37 = uVar33 & uVar48 ^ uVar39;
        uVar46 = uVar53 & uVar36 ^ uVar28;
        uVar47 = uVar47 & uVar38 ^ uVar28 ^ uVar31;
        uVar28 = uVar17 ^ local_d8 & uVar24 ^ uVar46;
        uVar38 = uVar38 & uVar52 ^ uVar23;
        uVar48 = uVar28 ^ uVar37 ^ uVar38;
        uVar38 = uVar38 ^ uVar41 & uVar33;
        uVar52 = uVar49 & uVar43 ^ uVar31 ^ uVar38;
        uVar38 = uVar38 ^ uVar29 ^ uVar36 & uVar42;
        uVar36 = uVar41 & uVar33 ^ uVar47;
        uVar53 = (uVar53 ^ local_d8) & uVar25 ^ uVar38;
        uVar38 = uVar38 ^ uVar47;
        uVar31 = uVar18 & (uVar41 ^ uVar26) ^ uVar28 ^ uVar52;
        uVar52 = uVar52 ^ uVar17 ^ uVar37;
        uVar46 = uVar46 ^ uVar53;
        uVar53 = uVar53 ^ uVar39 ^ local_d8 & uVar24;
        uVar26 = uVar24 & (uVar41 ^ uVar30) ^ uVar29 ^ uVar31;
        uVar28 = uVar46 ^ uVar36;
        uVar31 = uVar43 & uVar22 ^ uVar23 ^ uVar36 ^ uVar31;
        uVar48 = ((uVar48 >> 8 ^ uVar48) & 0xcc00cc00cc00cc) * 0x101 ^ uVar48;
        psVar2 = psVar19->vt;
        uVar52 = ((uVar52 >> 8 ^ uVar52) & 0xcc00cc00cc00cc) * 0x101 ^ uVar52;
        uVar26 = ((uVar26 >> 8 ^ uVar26) & 0xcc00cc00cc00cc) * 0x101 ^ uVar26;
        uVar53 = ((uVar53 >> 8 ^ uVar53) & 0xcc00cc00cc00cc) * 0x101 ^ uVar53;
        uVar46 = ((uVar46 >> 8 ^ uVar46) & 0xcc00cc00cc00cc) * 0x101 ^ uVar46;
        uVar31 = ((uVar31 >> 8 ^ uVar31) & 0xcc00cc00cc00cc) * 0x101 ^ uVar31;
        uVar28 = ((uVar28 >> 8 ^ uVar28) & 0xcc00cc00cc00cc) * 0x101 ^ uVar28;
        uVar38 = ((uVar38 >> 8 ^ uVar38) & 0xcc00cc00cc00cc) * 0x101 ^ uVar38;
        psVar3 = psVar14[9].vt;
        psVar4 = psVar14[10].vt;
        psVar5 = psVar14[0xb].vt;
        psVar6 = psVar14[0xc].vt;
        psVar7 = psVar14[0xd].vt;
        psVar8 = psVar14[0xe].vt;
        psVar9 = psVar14[0xf].vt;
        lVar16 = 0;
        do {
          bVar15 = (byte)lVar16;
          uVar22 = ((uVar52 & 0x5555555555555555 | (uVar52 & 0xa000a000a000a) << 0xc |
                    uVar52 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar3) >> (bVar15 & 0x3f) & 0xffff |
                   (ulong)(uint)((int)(((uVar53 & 0x5555555555555555 |
                                         (uVar53 & 0xa000a000a000a) << 0xc |
                                        uVar53 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar5) >>
                                      (bVar15 & 0x3f)) << 0x10) |
                   (((uVar31 & 0x5555555555555555 | (uVar31 & 0xa000a000a000a) << 0xc |
                     uVar31 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar7) >> (bVar15 & 0x3f) & 0xffff)
                   << 0x20 | (((uVar38 & 0x5555555555555555 | (uVar38 & 0xa000a000a000a) << 0xc |
                               uVar38 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar9) >> (bVar15 & 0x3f))
                             << 0x30;
          uVar36 = ((uVar48 & 0x5555555555555555 | (uVar48 & 0xa000a000a000a) << 0xc |
                    uVar48 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar2) >> (bVar15 & 0x3f) & 0xffff |
                   (ulong)(uint)((int)(((uVar26 & 0x5555555555555555 |
                                         (uVar26 & 0xa000a000a000a) << 0xc |
                                        uVar26 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar4) >>
                                      (bVar15 & 0x3f)) << 0x10) |
                   (((uVar46 & 0x5555555555555555 | (uVar46 & 0xa000a000a000a) << 0xc |
                     uVar46 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar6) >> (bVar15 & 0x3f) & 0xffff)
                   << 0x20 | (((uVar28 & 0x5555555555555555 | (uVar28 & 0xa000a000a000a) << 0xc |
                               uVar28 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar8) >> (bVar15 & 0x3f))
                             << 0x30;
          uVar30 = (uVar36 >> 8 ^ uVar22) & 0xff00ff00ff00ff;
          uVar36 = uVar30 << 8 ^ uVar36;
          uVar30 = uVar30 ^ uVar22;
          uVar22 = (ulong)(((uint)(uVar36 >> 0x1c) ^ (uint)uVar36) & 0xf0f0f0f0);
          uVar36 = (uVar22 << 0x1c | uVar22) ^ uVar36;
          uVar22 = (ulong)(((uint)(uVar30 >> 0x1c) ^ (uint)uVar30) & 0xf0f0f0f0);
          uVar30 = (uVar22 << 0x1c | uVar22) ^ uVar30;
          uVar36 = ((uVar36 >> 0xe ^ uVar36) & 0xcccc0000cccc) * 0x4001 ^ uVar36;
          uVar30 = ((uVar30 >> 0xe ^ uVar30) & 0xcccc0000cccc) * 0x4001 ^ uVar30;
          uVar36 = ((uVar36 >> 7 ^ uVar36) & 0xaa00aa00aa00aa) * 0x81 ^ uVar36;
          uVar30 = ((uVar30 >> 7 ^ uVar30) & 0xaa00aa00aa00aa) * 0x81 ^ uVar30;
          *(char *)((long)&ciph[-9].vt + lVar16) = (char)uVar36;
          *(char *)((long)ciph + lVar16 + -0x47) = (char)(uVar36 >> 8);
          *(char *)((long)ciph + lVar16 + -0x46) = (char)(uVar36 >> 0x10);
          *(char *)((long)ciph + lVar16 + -0x45) = (char)(uVar36 >> 0x18);
          *(char *)((long)ciph + lVar16 + -0x44) = (char)(uVar36 >> 0x20);
          *(char *)((long)ciph + lVar16 + -0x43) = (char)(uVar36 >> 0x28);
          *(char *)((long)ciph + lVar16 + -0x42) = (char)(uVar36 >> 0x30);
          *(char *)((long)ciph + lVar16 + -0x41) = (char)(uVar36 >> 0x38);
          *(char *)((long)&ciph[-8].vt + lVar16) = (char)uVar30;
          *(char *)((long)ciph + lVar16 + -0x3f) = (char)(uVar30 >> 8);
          *(char *)((long)ciph + lVar16 + -0x3e) = (char)(uVar30 >> 0x10);
          *(char *)((long)ciph + lVar16 + -0x3d) = (char)(uVar30 >> 0x18);
          *(char *)((long)ciph + lVar16 + -0x3c) = (char)(uVar30 >> 0x20);
          *(char *)((long)ciph + lVar16 + -0x3b) = (char)(uVar30 >> 0x28);
          *(char *)((long)ciph + lVar16 + -0x3a) = (char)(uVar30 >> 0x30);
          *(char *)((long)ciph + lVar16 + -0x39) = (char)(uVar30 >> 0x38);
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x40);
        psVar1->new = (_func_ssh_cipher_ptr_ssh_cipheralg_ptr *)(ciph + -9);
      }
      memxor16(vblk,vblk,psVar1->new);
      psVar1->new = psVar1->new + 0x10;
      vblk = (void *)((long)vblk + 0x10);
    } while (vblk < pvVar45);
  }
  return;
}

Assistant:

static inline void aes_sdctr_sw(
    ssh_cipher *ciph, void *vblk, int blklen)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);

    /*
     * SDCTR encrypt/decrypt loops round one block at a time XORing
     * the keystream into the user's data, and periodically has to run
     * a parallel encryption operation to get more keystream.
     */

    uint8_t *keystream_end =
        ctx->iv.sdctr.keystream + sizeof(ctx->iv.sdctr.keystream);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {

        if (ctx->iv.sdctr.keystream_pos == keystream_end) {
            /*
             * Generate some keystream.
             */
            for (uint8_t *block = ctx->iv.sdctr.keystream;
                 block < keystream_end; block += 16) {
                /* Format the counter value into the buffer. */
                for (unsigned i = 0; i < SDCTR_WORDS; i++)
                    PUT_BIGNUMINT_MSB_FIRST(
                        block + 16 - BIGNUM_INT_BYTES - i*BIGNUM_INT_BYTES,
                        ctx->iv.sdctr.counter[i]);

                /* Increment the counter. */
                BignumCarry carry = 1;
                for (unsigned i = 0; i < SDCTR_WORDS; i++)
                    BignumADC(ctx->iv.sdctr.counter[i], carry,
                              ctx->iv.sdctr.counter[i], 0, carry);
            }

            /* Encrypt all those counter blocks. */
            aes_sliced_e_parallel(ctx->iv.sdctr.keystream,
                                  ctx->iv.sdctr.keystream, &ctx->sk);

            /* Reset keystream_pos to the start of the buffer. */
            ctx->iv.sdctr.keystream_pos = ctx->iv.sdctr.keystream;
        }

        memxor16(blk, blk, ctx->iv.sdctr.keystream_pos);
        ctx->iv.sdctr.keystream_pos += 16;
    }
}